

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

void filemgr_prefetch(filemgr *file,filemgr_config *config,err_log_callback *log_callback)

{
  bool bVar1;
  uint64_t uVar2;
  atomic<unsigned_long> *atomic_val;
  long *__arg;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  filemgr_prefetch_args *args;
  uint64_t bcache_free_space;
  undefined8 in_stack_ffffffffffffffd8;
  
  uVar2 = bcache_get_num_free_blocks();
  atomic_val = (atomic<unsigned_long> *)(*(uint *)(in_RDI + 0x10) * uVar2);
  pthread_spin_lock((pthread_spinlock_t *)(in_RDI + 0x1a0));
  uVar2 = atomic_get_uint64_t(atomic_val,(memory_order)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
  if ((uVar2 != 0) && ((atomic<unsigned_long> *)0x3fffff < atomic_val)) {
    __arg = (long *)calloc(1,0x20);
    *__arg = in_RDI;
    __arg[1] = *(long *)(in_RSI + 0x18);
    __arg[2] = in_RDX;
    bVar1 = atomic_cas_uint8_t((atomic<unsigned_char> *)atomic_val,(uint8_t)((ulong)__arg >> 0x38),
                               (uint8_t)((ulong)__arg >> 0x30));
    if (bVar1) {
      pthread_create((pthread_t *)(in_RDI + 0x188),(pthread_attr_t *)0x0,_filemgr_prefetch_thread,
                     __arg);
    }
  }
  pthread_spin_unlock((pthread_spinlock_t *)(in_RDI + 0x1a0));
  return;
}

Assistant:

void filemgr_prefetch(struct filemgr *file,
                      struct filemgr_config *config,
                      err_log_callback *log_callback)
{
    uint64_t bcache_free_space;

    bcache_free_space = bcache_get_num_free_blocks();
    bcache_free_space *= file->blocksize;

    // block cache should have free space larger than FILEMGR_PREFETCH_UNIT
    spin_lock(&file->lock);
    if (atomic_get_uint64_t(&file->last_commit) > 0 &&
        bcache_free_space >= FILEMGR_PREFETCH_UNIT) {
        // invoke prefetch thread
        struct filemgr_prefetch_args *args;
        args = (struct filemgr_prefetch_args *)
               calloc(1, sizeof(struct filemgr_prefetch_args));
        args->file = file;
        args->duration = config->prefetch_duration;
        args->log_callback = log_callback;

        if (atomic_cas_uint8_t(&file->prefetch_status, FILEMGR_PREFETCH_IDLE,
                               FILEMGR_PREFETCH_RUNNING)) {
            thread_create(&file->prefetch_tid, _filemgr_prefetch_thread, args);
        }
    }
    spin_unlock(&file->lock);
}